

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_error_code_e
ktxTexture2_IterateLoadLevelFaces(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxSupercmpScheme kVar1;
  ktxTexture_protected *pkVar2;
  ktxTexture2_private *pkVar3;
  ktxStream_setpos p_Var4;
  byte bVar5;
  ktxStream *pkVar6;
  ktx_error_code_e kVar7;
  uint uVar8;
  ZSTD_ErrorCode ZVar9;
  uchar *pSrc;
  ktx_uint64_t kVar10;
  ulong uVar11;
  uint level;
  int iVar12;
  uchar *puVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ktx_error_code_e local_a4;
  uchar *local_90;
  ZSTD_DCtx *local_88;
  uchar *local_80;
  ktx_size_t uncompressedDataSize;
  ktxStream *local_58;
  PFNKTXITERCB local_50;
  void *local_48;
  size_t local_40;
  long local_38;
  undefined1 auVar21 [12];
  
  pkVar2 = This->_protected;
  uncompressedDataSize = 0;
  if (This->classId != ktxTexture2_c) {
    return KTX_INVALID_OPERATION;
  }
  kVar1 = This->supercompressionScheme;
  if (KTX_SS_END_RANGE < kVar1) {
    return KTX_INVALID_OPERATION;
  }
  if (kVar1 == KTX_SS_BASIS_LZ) {
    return KTX_INVALID_OPERATION;
  }
  if (iterCb == (PFNKTXITERCB)0x0) {
    return KTX_INVALID_VALUE;
  }
  if ((pkVar2->_stream).data.file == (FILE *)0x0) {
    return KTX_INVALID_OPERATION;
  }
  pkVar3 = This->_private;
  local_40 = pkVar3->_levelIndex[0].byteLength;
  local_48 = userdata;
  pSrc = (uchar *)malloc(local_40);
  if (pSrc == (uchar *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  if ((kVar1 & ~KTX_SS_BASIS_LZ) == KTX_SS_ZSTD) {
    uncompressedDataSize = pkVar3->_levelIndex[0].uncompressedByteLength;
    local_90 = (uchar *)malloc(uncompressedDataSize);
    if (local_90 == (uchar *)0x0) {
      local_a4 = KTX_OUT_OF_MEMORY;
      local_88 = (ZSTD_DCtx *)0x0;
      local_90 = (uchar *)0x0;
      goto LAB_001f1924;
    }
    local_80 = local_90;
    if (kVar1 == KTX_SS_ZSTD) {
      local_88 = ZSTD_createDCtx();
    }
    else {
      local_88 = (ZSTD_DCtx *)0x0;
    }
  }
  else {
    local_88 = (ZSTD_DCtx *)0x0;
    local_90 = (uchar *)0x0;
    local_80 = pSrc;
  }
  local_58 = &pkVar2->_stream;
  level = This->numLevels;
  local_50 = iterCb;
LAB_001f16a0:
  do {
    pkVar6 = local_58;
    level = level - 1;
    if ((int)level < 0) {
      (*(pkVar2->_stream).destruct)(local_58);
      This->_private->_firstLevelFileOffset = 0;
      local_a4 = KTX_SUCCESS;
      break;
    }
    bVar5 = (byte)level;
    uVar16 = This->baseWidth >> (bVar5 & 0x1f);
    iVar17 = uVar16 + (uVar16 == 0);
    uVar16 = This->baseHeight >> (bVar5 & 0x1f);
    iVar14 = uVar16 + (uVar16 == 0);
    uVar16 = This->baseDepth >> (bVar5 & 0x1f);
    iVar12 = uVar16 + (uVar16 == 0);
    uVar11 = pkVar3->_levelIndex[level & 0x7fffffff].byteLength;
    local_a4 = KTX_FILE_DATA_ERROR;
    if (local_40 < uVar11) break;
    p_Var4 = (pkVar2->_stream).setpos;
    local_38 = (ulong)(level & 0x7fffffff) * 0x18;
    kVar10 = ktxTexture2_levelFileOffset(This,level);
    local_a4 = (*p_Var4)(pkVar6,kVar10);
    if (local_a4 != KTX_SUCCESS) break;
    local_a4 = (*pkVar6->read)(pkVar6,pSrc,uVar11);
    auVar18._8_8_ = extraout_XMM0_Qb;
    auVar18._0_8_ = extraout_XMM0_Qa;
    auVar21 = auVar18._4_12_;
    if (local_a4 != KTX_SUCCESS) break;
    if (This->supercompressionScheme != KTX_SS_END_RANGE) {
      if (This->supercompressionScheme != KTX_SS_ZSTD) goto LAB_001f17c5;
      uVar11 = ZSTD_decompressDCtx(local_88,local_90,uncompressedDataSize,pSrc,uVar11);
      uVar16 = ZSTD_isError(uVar11);
      auVar21 = extraout_var;
      if (uVar16 == 0) goto LAB_001f17c5;
      ZVar9 = ZSTD_getErrorCode(uVar11);
      if (ZVar9 == ZSTD_error_dstSize_tooSmall) {
LAB_001f191d:
        local_a4 = KTX_DECOMPRESS_LENGTH_ERROR;
      }
      else if (ZVar9 == ZSTD_error_memory_allocation) {
        local_a4 = KTX_OUT_OF_MEMORY;
      }
      else {
        local_a4 = KTX_FILE_DATA_ERROR;
        if (ZVar9 == ZSTD_error_checksum_wrong) {
          local_a4 = KTX_DECOMPRESS_CHECKSUM_ERROR;
        }
      }
      break;
    }
    kVar7 = ktxUncompressZLIBInt(local_90,&uncompressedDataSize,pSrc,uVar11);
    auVar21 = extraout_var_00;
    if (kVar7 != KTX_SUCCESS) {
      return kVar7;
    }
LAB_001f17c5:
    if (*(ulong *)((long)&pkVar3->_levelIndex[0].uncompressedByteLength + local_38) != uVar11)
    goto LAB_001f191d;
    if ((This->isCubemap == true) && (This->isArray == false)) {
      auVar20._0_4_ = (float)iVar17 / (float)(pkVar2->_formatSize).blockWidth;
      auVar20._4_12_ = auVar21;
      auVar18 = roundss(auVar20,auVar20,10);
      auVar19._4_12_ = auVar18._4_12_;
      auVar19._0_4_ = (float)iVar14 / (float)(pkVar2->_formatSize).blockHeight;
      auVar20 = roundss(auVar19,auVar19,10);
      uVar16 = (pkVar2->_formatSize).minBlocksX;
      uVar15 = (uint)(long)auVar18._0_4_;
      if (uVar15 < uVar16) {
        uVar15 = uVar16;
      }
      uVar8 = (uint)(long)auVar20._0_4_;
      if (uVar8 < uVar16) {
        uVar8 = uVar16;
      }
      uVar11 = (ulong)(uVar15 * (pkVar2->_formatSize).blockSizeInBits * uVar8 >> 3);
      puVar13 = local_80;
      for (uVar16 = 0; uVar16 < This->numFaces; uVar16 = uVar16 + 1) {
        local_a4 = (*local_50)(level,uVar16,iVar17,iVar14,iVar12,uVar11,puVar13,local_48);
        if (local_a4 != KTX_SUCCESS) goto LAB_001f1924;
        puVar13 = puVar13 + uVar11;
      }
      goto LAB_001f16a0;
    }
    local_a4 = (*local_50)(level,0,iVar17,iVar14,iVar12,uVar11 & 0xffffffff,local_80,local_48);
  } while (local_a4 == KTX_SUCCESS);
LAB_001f1924:
  free(pSrc);
  free(local_90);
  if (local_88 != (ZSTD_DCtx *)0x0) {
    ZSTD_freeDCtx(local_88);
  }
  return local_a4;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLoadLevelFaces(ktxTexture2* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PROTECTED(ktxTexture);
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktxLevelIndexEntry* levelIndex;
    ktx_size_t      dataSize = 0, uncompressedDataSize = 0;
    KTX_error_code  result = KTX_SUCCESS;
    ktx_uint8_t*    dataBuf = NULL;
    ktx_uint8_t*    uncompressedDataBuf = NULL;
    ktx_uint8_t*    pData;
    ZSTD_DCtx*      dctx = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture2_c)
        return KTX_INVALID_OPERATION;

    if (This->supercompressionScheme != KTX_SS_NONE &&
        This->supercompressionScheme != KTX_SS_ZSTD &&
        This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    levelIndex = This->_private->_levelIndex;

    // Allocate memory sufficient for the base level
    dataSize = levelIndex[0].byteLength;
    dataBuf = malloc(dataSize);
    if (!dataBuf)
        return KTX_OUT_OF_MEMORY;
    if (This->supercompressionScheme == KTX_SS_ZSTD || This->supercompressionScheme == KTX_SS_ZLIB) {
        uncompressedDataSize = levelIndex[0].uncompressedByteLength;
        uncompressedDataBuf = malloc(uncompressedDataSize);
        if (!uncompressedDataBuf) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            dctx = ZSTD_createDCtx();
        }
        pData = uncompressedDataBuf;
    } else {
        pData = dataBuf;
    }

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; --level)
    {
        ktx_size_t   levelSize;
        GLsizei      width, height, depth;

        // Array textures have the same number of layers at each mip level.
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].byteLength;
        if (dataSize < levelSize) {
            // Levels cannot be larger than the base level
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        // Use setpos so we skip any padding.
        result = stream->setpos(stream,
                                ktxTexture2_levelFileOffset(This, level));
        if (result != KTX_SUCCESS)
            goto cleanup;

        result = stream->read(stream, dataBuf, levelSize);
        if (result != KTX_SUCCESS)
            goto cleanup;

        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            levelSize =
                ZSTD_decompressDCtx(dctx, uncompressedDataBuf,
                                  uncompressedDataSize,
                                  dataBuf,
                                  levelSize);
            if (ZSTD_isError(levelSize)) {
                ZSTD_ErrorCode error = ZSTD_getErrorCode(levelSize);
                switch(error) {
                  case ZSTD_error_dstSize_tooSmall:
                    result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                    goto cleanup;
                  case ZSTD_error_checksum_wrong:
                    result =  KTX_DECOMPRESS_CHECKSUM_ERROR;
                    goto cleanup;
                  case ZSTD_error_memory_allocation:
                    result = KTX_OUT_OF_MEMORY;
                    goto cleanup;
                  default:
                    result = KTX_FILE_DATA_ERROR;
                    goto cleanup;
                }
            }

            // We don't fix up the texture's dataSize, levelIndex or
            // _requiredAlignment because after this function completes there
            // is no way to get at the texture's data.
            //nindex[level].byteOffset = levelOffset;
            //nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                                //levelByteLength;
        } else if (This->supercompressionScheme == KTX_SS_ZLIB) {
            result = ktxUncompressZLIBInt(uncompressedDataBuf,
                                            &uncompressedDataSize,
                                            dataBuf,
                                            levelSize);
            if (result != KTX_SUCCESS)
                return result;
        }

        if (levelIndex[level].uncompressedByteLength != levelSize) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }


#if IS_BIG_ENDIAN
        switch (prtctd->_typeSize) {
          case 2:
            _ktxSwapEndian16((ktx_uint16_t*)pData, levelSize / 2);
            break;
          case 4:
            _ktxSwapEndian32((ktx_uint32_t*)pDest, levelSize / 4);
            break;
          case 8:
            _ktxSwapEndian64((ktx_uint64_t*)pDest, levelSize / 8);
            break;
        }
#endif

        // With the exception of non-array cubemaps the entire level
        // is passed at once because that is how OpenGL and Vulkan need them.
        // Vulkan could take all the faces at once too but we iterate
        // them separately for OpenGL.
        if (This->isCubemap && !This->isArray) {
            ktx_uint8_t* pFace = pData;
            struct blockCount {
                ktx_uint32_t x, y;
            } blockCount;
            ktx_size_t faceSize;

            blockCount.x
              = (uint32_t)ceilf((float)width / prtctd->_formatSize.blockWidth);
            blockCount.y
              = (uint32_t)ceilf((float)height / prtctd->_formatSize.blockHeight);
            blockCount.x = MAX(prtctd->_formatSize.minBlocksX, blockCount.x);
            blockCount.y = MAX(prtctd->_formatSize.minBlocksX, blockCount.y);
            faceSize = blockCount.x * blockCount.y
                       * prtctd->_formatSize.blockSizeInBits / 8;

            for (ktx_uint32_t face = 0; face < This->numFaces; ++face) {
                result = iterCb(level, face,
                                width, height, depth,
                                (ktx_uint32_t)faceSize, pFace, userdata);
                pFace += faceSize;
                if (result != KTX_SUCCESS)
                    goto cleanup;
            }
        } else {
            result = iterCb(level, 0,
                             width, height, depth,
                             (ktx_uint32_t)levelSize, pData, userdata);
            if (result != KTX_SUCCESS)
                goto cleanup;
       }
    }

    // No further need for this.
    stream->destruct(stream);
    This->_private->_firstLevelFileOffset = 0;
cleanup:
    free(dataBuf);
    if (uncompressedDataBuf) free(uncompressedDataBuf);
    if (dctx) ZSTD_freeDCtx(dctx);

    return result;
}